

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gsl.hpp
# Opt level: O1

span<const_char,__1L> __thiscall
pstore::gsl::span<const_char,_5L>::subspan
          (span<const_char,_5L> *this,index_type offset,index_type count)

{
  pointer peVar1;
  long size;
  span<const_char,__1L> sVar2;
  extent_type<_1L> local_20 [2];
  
  if (((ulong)offset < 6) && ((count == -1 || ((-1 < count && (count + offset < 6)))))) {
    peVar1 = (this->storage_).data_;
    size = 5 - offset;
    if (count != -1) {
      size = count;
    }
    details::extent_type<-1L>::extent_type(local_20,size);
    sVar2.storage_.data_ = peVar1 + offset;
    sVar2.storage_.super_extent_type<_1L>.size_ = local_20[0].size_;
    return (span<const_char,__1L>)sVar2.storage_;
  }
  assert_failed("(offset == 0 || (offset > 0 && offset <= size ())) && (count == dynamic_extent || (count >= 0 && offset + count <= size ()))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/gsl.hpp"
                ,0x17b);
}

Assistant:

span<element_type, dynamic_extent>
            subspan (index_type const offset, index_type const count = dynamic_extent) const
                noexcept {
                PSTORE_ASSERT (
                    (offset == 0 || (offset > 0 && offset <= size ())) &&
                    (count == dynamic_extent || (count >= 0 && offset + count <= size ())));
                return {data () + offset, count == dynamic_extent ? size () - offset : count};
            }